

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
::find_or_prepare_insert_non_soo<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
          *this,pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *key)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined1 uVar21;
  bool bVar22;
  ushort uVar23;
  uint uVar24;
  uintptr_t v;
  uint64_t uVar25;
  ulong uVar26;
  CommonFields *common;
  size_t sVar27;
  ctrl_t *pcVar28;
  ulong uVar29;
  ulong uVar30;
  PolicyFunctions *in_R9;
  ulong uVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  __m128i match;
  undefined1 auVar38 [16];
  FindInfo target;
  char cVar32;
  char cVar35;
  char cVar36;
  char cVar37;
  
  uVar29 = ((ulong)key->first ^ 0x830380) * -0x234dd359734ecb13;
  uVar30 = ((uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
             (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
             (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 | (uVar29 & 0xff00) << 0x28 |
            uVar29 << 0x38) ^ (ulong)key->first) * -0x234dd359734ecb13;
  uVar29 = (key->second)._M_string_length;
  uVar25 = hash_internal::MixingHashState::CombineContiguousImpl
                     (uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                      (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                      (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                      (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38,(key->second)._M_dataplus._M_p,
                      uVar29);
  uVar30 = *(ulong *)this;
  if ((uVar30 + 1 & uVar30) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar26 = (uVar25 ^ uVar29) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 | (uVar26 & 0xff0000000000) >> 0x18
            | (uVar26 & 0xff00000000) >> 8 | (uVar26 & 0xff000000) << 8 |
            (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
  uVar29 = *(ulong *)(this + 0x10);
  uVar31 = (ulong)common >> 7 ^ uVar29 >> 0xc;
  uVar21 = (undefined1)(uVar26 >> 0x38);
  auVar33 = ZEXT216(CONCAT11(uVar21,uVar21) & 0x7f7f);
  auVar33 = pshuflw(auVar33,auVar33,0);
  uVar26 = 0;
  do {
    uVar31 = uVar31 & uVar30;
    pcVar1 = (char *)(uVar29 + uVar31);
    cVar5 = *pcVar1;
    cVar6 = pcVar1[1];
    cVar7 = pcVar1[2];
    cVar8 = pcVar1[3];
    cVar9 = pcVar1[4];
    cVar10 = pcVar1[5];
    cVar11 = pcVar1[6];
    cVar12 = pcVar1[7];
    cVar13 = pcVar1[8];
    cVar14 = pcVar1[9];
    cVar15 = pcVar1[10];
    cVar16 = pcVar1[0xb];
    cVar17 = pcVar1[0xc];
    cVar18 = pcVar1[0xd];
    cVar19 = pcVar1[0xe];
    cVar20 = pcVar1[0xf];
    cVar32 = auVar33[0];
    auVar34[0] = -(cVar32 == cVar5);
    cVar35 = auVar33[1];
    auVar34[1] = -(cVar35 == cVar6);
    cVar36 = auVar33[2];
    auVar34[2] = -(cVar36 == cVar7);
    cVar37 = auVar33[3];
    auVar34[3] = -(cVar37 == cVar8);
    auVar34[4] = -(cVar32 == cVar9);
    auVar34[5] = -(cVar35 == cVar10);
    auVar34[6] = -(cVar36 == cVar11);
    auVar34[7] = -(cVar37 == cVar12);
    auVar34[8] = -(cVar32 == cVar13);
    auVar34[9] = -(cVar35 == cVar14);
    auVar34[10] = -(cVar36 == cVar15);
    auVar34[0xb] = -(cVar37 == cVar16);
    auVar34[0xc] = -(cVar32 == cVar17);
    auVar34[0xd] = -(cVar35 == cVar18);
    auVar34[0xe] = -(cVar36 == cVar19);
    auVar34[0xf] = -(cVar37 == cVar20);
    uVar23 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
    uVar24 = (uint)uVar23;
    while (uVar23 != 0) {
      uVar3 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      sVar27 = uVar3 + uVar31 & uVar30;
      bVar22 = std::
               equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator()((equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this,(pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)(sVar27 * 0x30 + *(long *)(this + 0x18)),key);
      if (bVar22) {
        if (*(long *)(this + 0x10) == 0) goto LAB_003888d7;
        pcVar28 = (ctrl_t *)(*(long *)(this + 0x10) + sVar27);
        bVar22 = false;
        goto LAB_00388888;
      }
      uVar23 = (ushort)(uVar24 - 1) & (ushort)uVar24;
      uVar24 = CONCAT22((short)(uVar24 - 1 >> 0x10),uVar23);
    }
    auVar38[0] = -(cVar5 == -0x80);
    auVar38[1] = -(cVar6 == -0x80);
    auVar38[2] = -(cVar7 == -0x80);
    auVar38[3] = -(cVar8 == -0x80);
    auVar38[4] = -(cVar9 == -0x80);
    auVar38[5] = -(cVar10 == -0x80);
    auVar38[6] = -(cVar11 == -0x80);
    auVar38[7] = -(cVar12 == -0x80);
    auVar38[8] = -(cVar13 == -0x80);
    auVar38[9] = -(cVar14 == -0x80);
    auVar38[10] = -(cVar15 == -0x80);
    auVar38[0xb] = -(cVar16 == -0x80);
    auVar38[0xc] = -(cVar17 == -0x80);
    auVar38[0xd] = -(cVar18 == -0x80);
    auVar38[0xe] = -(cVar19 == -0x80);
    auVar38[0xf] = -(cVar20 == -0x80);
    uVar23 = (ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe | (ushort)(auVar38[0xf] >> 7) << 0xf;
    if (uVar23 != 0) {
      bVar22 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar22) {
        uVar4 = 0xf;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar24 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar24 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = uVar26;
      sVar27 = PrepareInsertNonSoo((container_internal *)this,common,uVar24 + uVar31 & uVar30,target
                                   ,in_R9);
      if (*(long *)(this + 0x10) == 0) {
LAB_003888d7:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>]"
                     );
      }
      pcVar28 = (ctrl_t *)(*(long *)(this + 0x10) + sVar27);
      bVar22 = true;
LAB_00388888:
      lVar2 = *(long *)(this + 0x18);
      (__return_storage_ptr__->first).ctrl_ = pcVar28;
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(sVar27 * 0x30 + lVar2);
      __return_storage_ptr__->second = bVar22;
      return __return_storage_ptr__;
    }
    uVar31 = uVar31 + uVar26 + 0x10;
    uVar26 = uVar26 + 0x10;
    if (*(ulong *)this < uVar26) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>, K = std::pair<const google::protobuf::Message *, std::basic_string<char>>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }